

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

ostream * filesystem::operator<<(ostream *os,path *path)

{
  string local_30;
  
  filesystem::path::str_abi_cxx11_(&local_30,path,native_path);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const path &path) {
        os << path.str();
        return os;
    }